

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcApi.c
# Opt level: O1

void Mvc_CoverMakeEmpty(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  Mvc_Cube_t *pMVar2;
  
  pMVar2 = (pCover->lCubes).pHead;
  if (pMVar2 == (Mvc_Cube_t *)0x0) {
    pMVar1 = (Mvc_Cube_t *)0x0;
  }
  else {
    pMVar1 = pMVar2->pNext;
  }
  while (pMVar2 != (Mvc_Cube_t *)0x0) {
    Mvc_CubeFree(pCover,pMVar2);
    pMVar2 = pMVar1;
    if (pMVar1 == (Mvc_Cube_t *)0x0) {
      pMVar1 = (Mvc_Cube_t *)0x0;
    }
    else {
      pMVar1 = pMVar1->pNext;
    }
  }
  (pCover->lCubes).pHead = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).pTail = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).nItems = 0;
  return;
}

Assistant:

void Mvc_CoverMakeEmpty( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube, * pCube2;
    Mvc_CoverForEachCubeSafe( pCover, pCube, pCube2 )
        Mvc_CubeFree( pCover, pCube );
    pCover->lCubes.nItems = 0;
    pCover->lCubes.pHead = NULL;
    pCover->lCubes.pTail = NULL;
}